

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameTitle.cpp
# Opt level: O2

void __thiscall GameTitle::moveInText(GameTitle *this,Screen *screen,int color)

{
  size_type sVar1;
  int iVar2;
  int start;
  int iVar3;
  int start_00;
  int iVar4;
  int iVar5;
  int finish;
  int finish_00;
  int iVar6;
  int finish_01;
  GameTitle *this_00;
  bool bVar7;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (this->firstWord).screenLocation[0] = 0;
  iVar2 = Screen::getScreenSizeX(screen);
  iVar2 = iVar2 - (int)(this->firstWord).text._M_string_length;
  (this->firstWord).screenLocation[1] = iVar2;
  (this->secondWord).screenLocation[0] = 0;
  (this->secondWord).screenLocation[1] = 0;
  start = Screen::getScreenSizeY(screen);
  (this->thirdWord).screenLocation[0] = start;
  iVar3 = Screen::getScreenSizeX(screen);
  iVar3 = iVar3 - (int)(this->thirdWord).text._M_string_length;
  (this->thirdWord).screenLocation[1] = iVar3;
  start_00 = Screen::getScreenSizeY(screen);
  (this->fourthWord).screenLocation[0] = start_00;
  (this->fourthWord).screenLocation[1] = 0;
  iVar4 = Screen::getScreenSizeY(screen);
  iVar4 = iVar4 / 2;
  iVar5 = Screen::getScreenSizeX(screen);
  finish = (int)(this->title)._M_string_length / -2 + iVar5 / 2;
  finish_01 = (int)(this->firstWord).text._M_string_length + finish;
  finish_00 = (int)(this->secondWord).text._M_string_length + finish_01;
  sVar1 = (this->thirdWord).text._M_string_length;
  iVar5 = 0x31;
  while( true ) {
    bVar7 = iVar5 == 0;
    iVar5 = iVar5 + -1;
    if (bVar7) break;
    Screen::clearScreen(screen);
    std::__cxx11::string::string((string *)&local_b0,(string *)&this->firstWord);
    Screen::printString(screen,&local_b0,(this->firstWord).screenLocation[0],
                        (this->firstWord).screenLocation[1]);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::string((string *)&local_50,(string *)&this->secondWord);
    Screen::printString(screen,&local_50,(this->secondWord).screenLocation[0],
                        (this->secondWord).screenLocation[1]);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_70,(string *)&this->thirdWord);
    Screen::printString(screen,&local_70,(this->thirdWord).screenLocation[0],
                        (this->thirdWord).screenLocation[1]);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_90,(string *)&this->fourthWord);
    Screen::printString(screen,&local_90,(this->fourthWord).screenLocation[0],
                        (this->fourthWord).screenLocation[1]);
    std::__cxx11::string::~string((string *)&local_90);
    Screen::refreshScreen(screen);
    this_00 = (GameTitle *)0xa2c2;
    usleep(0xa2c2);
    iVar6 = calculateNewPosition(this_00,(this->firstWord).screenLocation[0],2,0,iVar4,true);
    (this->firstWord).screenLocation[0] = iVar6;
    iVar6 = calculateNewPosition(this_00,(this->firstWord).screenLocation[1],2,iVar2,finish,false);
    (this->firstWord).screenLocation[1] = iVar6;
    iVar6 = calculateNewPosition(this_00,(this->secondWord).screenLocation[0],2,0,iVar4,true);
    (this->secondWord).screenLocation[0] = iVar6;
    iVar6 = calculateNewPosition(this_00,(this->secondWord).screenLocation[1],2,0,finish_01,true);
    (this->secondWord).screenLocation[1] = iVar6;
    iVar6 = calculateNewPosition(this_00,(this->thirdWord).screenLocation[0],2,start,iVar4,false);
    (this->thirdWord).screenLocation[0] = iVar6;
    iVar6 = calculateNewPosition
                      (this_00,(this->thirdWord).screenLocation[1],2,iVar3,finish_00,false);
    (this->thirdWord).screenLocation[1] = iVar6;
    iVar6 = calculateNewPosition
                      (this_00,(this->fourthWord).screenLocation[0],2,start_00,iVar4,false);
    (this->fourthWord).screenLocation[0] = iVar6;
    iVar6 = calculateNewPosition
                      (this_00,(this->fourthWord).screenLocation[1],2,0,(int)sVar1 + finish_00,true)
    ;
    (this->fourthWord).screenLocation[1] = iVar6;
  }
  return;
}

Assistant:

void GameTitle::moveInText(Screen &screen, int color) {
    int animationLength = 2;
    unsigned int frameCounter = 0;
    int totalAnimationFrames = animationLength * FRAMES_PER_SECOND;
    int firstWordStartLocation[2];
    int firstWordEndLocation[2];
    int secondWordStartLocation[2];
    int secondWordEndLocation[2];
    int thirdWordStartLocation[2];
    int thirdWordEndLocation[2];
    int fourthWordStartLocation[2];
    int fourthWordEndLocation[2];

    // Set the initial locations of the text
    firstWordStartLocation[0] = firstWord.screenLocation[0] = 0;
    firstWordStartLocation[1] = firstWord.screenLocation[1] = screen.getScreenSizeX() - static_cast<int>(firstWord.text.length());

    secondWordStartLocation[0] = secondWord.screenLocation[0] = 0;
    secondWordStartLocation[1] = secondWord.screenLocation[1] = 0;

    thirdWordStartLocation[0] = thirdWord.screenLocation[0] = screen.getScreenSizeY();
    thirdWordStartLocation[1] = thirdWord.screenLocation[1] = screen.getScreenSizeX() - static_cast<int>(thirdWord.text.length());

    fourthWordStartLocation[0] = fourthWord.screenLocation[0] = screen.getScreenSizeY();
    fourthWordStartLocation[1] = fourthWord.screenLocation[1] = 0;

    // Calculate the end positions of the text
    firstWordEndLocation[0] = secondWordEndLocation[0] = thirdWordEndLocation[0] = fourthWordEndLocation[0] = (screen.getScreenSizeY() / 2);

    firstWordEndLocation[1] = ( screen.getScreenSizeX() / 2 ) - ( static_cast<int>( title.length() ) / 2 );
    secondWordEndLocation[1] = firstWordEndLocation[1] + static_cast<int>( firstWord.text.length() );
    thirdWordEndLocation[1] = secondWordEndLocation[1] + static_cast<int>( secondWord.text.length() );
    fourthWordEndLocation[1] = thirdWordEndLocation[1] + static_cast<int>( thirdWord.text.length() );

    // Turn on the color attribute
    //screen.turnAttrOn(COLOR_PAIR(color));

    // Loop through the words until they are all in their respective end positions
    while(static_cast<int>(frameCounter) <= totalAnimationFrames){
        // Print the words on the screen
        screen.clearScreen();
        screen.printString(firstWord.text, firstWord.screenLocation[0], firstWord.screenLocation[1]);
        screen.printString(secondWord.text, secondWord.screenLocation[0], secondWord.screenLocation[1]);
        screen.printString(thirdWord.text, thirdWord.screenLocation[0], thirdWord.screenLocation[1]);
        screen.printString(fourthWord.text, fourthWord.screenLocation[0], fourthWord.screenLocation[1]);

        screen.refreshScreen();
        usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND);

        // Move the words
        firstWord.screenLocation[0] = calculateNewPosition(firstWord.screenLocation[0],
                                                          animationLength,
                                                          firstWordStartLocation[0],
                                                          firstWordEndLocation[0],
                                                           DOWN);
        firstWord.screenLocation[1] = calculateNewPosition(firstWord.screenLocation[1],
                                                           animationLength,
                                                           firstWordStartLocation[1],
                                                           firstWordEndLocation[1],
                                                           LEFT);
        secondWord.screenLocation[0] = calculateNewPosition(secondWord.screenLocation[0],
                                                           animationLength,
                                                           secondWordStartLocation[0],
                                                           secondWordEndLocation[0],
                                                            DOWN);
        secondWord.screenLocation[1] = calculateNewPosition(secondWord.screenLocation[1],
                                                           animationLength,
                                                           secondWordStartLocation[1],
                                                           secondWordEndLocation[1],
                                                            RIGHT);
        thirdWord.screenLocation[0] = calculateNewPosition(thirdWord.screenLocation[0],
                                                           animationLength,
                                                           thirdWordStartLocation[0],
                                                           thirdWordEndLocation[0],
                                                            UP);
        thirdWord.screenLocation[1] = calculateNewPosition(thirdWord.screenLocation[1],
                                                           animationLength,
                                                           thirdWordStartLocation[1],
                                                           thirdWordEndLocation[1],
                                                           LEFT);
        fourthWord.screenLocation[0] = calculateNewPosition(fourthWord.screenLocation[0],
                                                           animationLength,
                                                           fourthWordStartLocation[0],
                                                           fourthWordEndLocation[0],
                                                            UP);
        fourthWord.screenLocation[1] = calculateNewPosition(fourthWord.screenLocation[1],
                                                           animationLength,
                                                           fourthWordStartLocation[1],
                                                           fourthWordEndLocation[1],
                                                            RIGHT);
        frameCounter++;
    }

    // Turn off the color attribute
    //screen.turnAttrOff(COLOR_PAIR(color));
}